

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bif.c
# Opt level: O0

void bifsetme(bifcxdef *ctx,int argc)

{
  ushort uVar1;
  long lVar2;
  undefined4 in_ESI;
  long in_RDI;
  objnum new_me;
  int in_stack_ffffffffffffffec;
  undefined2 in_stack_fffffffffffffff0;
  undefined2 in_stack_fffffffffffffff2;
  
  lVar2 = *(long *)(*(long *)(in_RDI + 8) + 0x20);
  *(long *)(*(long *)(in_RDI + 8) + 0x20) = lVar2 + -0x10;
  if (*(char *)(lVar2 + -0x10) != '\x02') {
    *(undefined4 *)(*(long *)**(undefined8 **)(in_RDI + 8) + 0x68) = 0;
    runsign((runcxdef *)
            CONCAT44(in_ESI,CONCAT22(in_stack_fffffffffffffff2,in_stack_fffffffffffffff0)),
            in_stack_ffffffffffffffec);
  }
  uVar1 = *(ushort *)(*(long *)(*(long *)(in_RDI + 8) + 0x20) + 8);
  if (uVar1 == 0xffff) {
    *(char **)(*(long *)**(undefined8 **)(in_RDI + 8) + 0x18) = "parserSetMe";
    *(undefined4 *)(*(long *)**(undefined8 **)(in_RDI + 8) + 0x68) = 1;
    runsign((runcxdef *)CONCAT44(in_ESI,CONCAT22(0xffff,in_stack_fffffffffffffff0)),(uint)uVar1);
  }
  voc_set_me((voccxdef *)CONCAT44(in_ESI,CONCAT22(uVar1,in_stack_fffffffffffffff0)),0);
  return;
}

Assistant:

void bifsetme(bifcxdef *ctx, int argc)
{
    objnum new_me;
    
    /* this function takes one argument */
    bifcntargs(ctx, 1, argc);

    /* get the new "Me" object */
    new_me = runpopobj(ctx->bifcxrun);

    /* "Me" cannot be nil */
    if (new_me == MCMONINV)
        runsig1(ctx->bifcxrun, ERR_INVVBIF, ERRTSTR, "parserSetMe");

    /* set the current "Me" object in the parser */
    voc_set_me(ctx->bifcxrun->runcxvoc, new_me);
}